

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall cmCTestScriptHandler::RestoreBackupDirectories(cmCTestScriptHandler *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  cmCTestScriptHandler *this_local;
  
  if ((this->Backup & 1U) != 0) {
    bVar1 = cmsys::SystemTools::FileExists(&this->SourceDir);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&this->SourceDir);
    }
    bVar1 = cmsys::SystemTools::FileExists(&this->BinaryDir);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&this->BinaryDir);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    rename(pcVar2,pcVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    rename(pcVar2,pcVar3);
  }
  return;
}

Assistant:

void cmCTestScriptHandler::RestoreBackupDirectories()
{
  // if we backed up the dirs and the build failed, then restore
  // the backed up dirs
  if (this->Backup) {
    // if for some reason those directories exist then first delete them
    if (cmSystemTools::FileExists(this->SourceDir)) {
      cmSystemTools::RemoveADirectory(this->SourceDir);
    }
    if (cmSystemTools::FileExists(this->BinaryDir)) {
      cmSystemTools::RemoveADirectory(this->BinaryDir);
    }
    // rename the src and binary directories
    rename(this->BackupSourceDir.c_str(), this->SourceDir.c_str());
    rename(this->BackupBinaryDir.c_str(), this->BinaryDir.c_str());
  }
}